

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int as154x(double *inp,int N,double *xreg,int optmethod,int p,int d,int q,int s,int P,int D,int Q,
          double *phi,double *theta,double *PHI,double *THETA,double *exog,int r,double *wmean,
          double *var,double *resid,double *loglik,double *hess,int cssml,int start,int imean)

{
  size_t sVar1;
  double dVar2;
  double *__ptr;
  double *__ptr_00;
  xlik_object pxVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  reg_object obj;
  double *pdVar9;
  ulong uVar10;
  void *pvVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  undefined4 in_register_00000084;
  ulong uVar17;
  ulong uVar18;
  double *pdVar19;
  ulong uVar20;
  bool bVar21;
  int M;
  int N_00;
  undefined1 local_130 [8];
  custom_function as154_min;
  int local_e8;
  int local_e4;
  int p_local;
  void *local_d8;
  void *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  double *local_90;
  uint local_84;
  double *local_80;
  ulong local_78;
  double *local_70;
  double *local_68;
  ulong local_60;
  ulong local_58;
  xlik_object local_50;
  uint local_48;
  char local_41;
  double *local_40;
  int local_34;
  
  iVar6 = D;
  iVar7 = s;
  local_58 = CONCAT44(in_register_00000084,p);
  local_a0 = (ulong)(uint)Q;
  local_b0 = (ulong)(uint)P;
  local_98 = (ulong)(uint)q;
  iVar4 = 0;
  if (xreg != (double *)0x0) {
    iVar4 = r;
  }
  local_68 = (double *)CONCAT44(local_68._4_4_,iVar4);
  local_e8 = p;
  local_84 = optmethod;
  local_48 = N;
  local_40 = xreg;
  local_34 = d;
  if (cssml == 1) {
    iVar4 = cssx(inp,N,xreg,optmethod,p,d,q,s,P,D,Q,phi,theta,PHI,THETA,exog,r,wmean,var,loglik,hess
                 ,start,imean);
    if (iVar4 != 1) {
      return iVar4;
    }
    iVar4 = checkroots_cerr(phi,&local_e8,theta,&q,PHI,&P,THETA,&Q);
    if (iVar4 == 10) {
      return 10;
    }
    if (iVar4 == 0xc) {
      return 0xc;
    }
  }
  else if (start == 0) {
    uVar10 = 0;
    uVar8 = 0;
    if (0 < p) {
      uVar8 = (ulong)(uint)p;
    }
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      phi[uVar10] = 0.0;
    }
    uVar10 = 0;
    uVar8 = 0;
    if (0 < q) {
      uVar8 = local_98;
    }
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      theta[uVar10] = 0.0;
    }
    uVar10 = 0;
    uVar8 = 0;
    if (0 < P) {
      uVar8 = local_b0;
    }
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      PHI[uVar10] = 0.0;
    }
    uVar10 = 0;
    uVar8 = 0;
    if (0 < Q) {
      uVar8 = local_a0;
    }
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      THETA[uVar10] = 0.0;
    }
  }
  uVar12 = local_48;
  local_e4 = iVar6 * iVar7;
  local_90 = (double *)CONCAT44(local_90._4_4_,local_48 - local_e4);
  local_50 = (xlik_object)((long)(int)(local_48 - local_e4) << 3);
  local_b8 = (double *)malloc((size_t)local_50);
  if (iVar6 < 1) {
    uVar10 = 0;
    uVar8 = 0;
    if (0 < (int)uVar12) {
      uVar8 = (ulong)uVar12;
    }
    for (; uVar12 = local_48, uVar5 = local_48, uVar8 != uVar10; uVar10 = uVar10 + 1) {
      local_b8[uVar10] = inp[uVar10];
    }
  }
  else {
    uVar5 = diffs(inp,uVar12,iVar6,iVar7,local_b8);
  }
  iVar6 = local_34;
  local_c0 = (double *)malloc((long)(int)(uVar5 - local_34) << 3);
  if (iVar6 < 1) {
    uVar10 = 0;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    for (; local_78 = (ulong)uVar5, uVar8 != uVar10; uVar10 = uVar10 + 1) {
      local_c0[uVar10] = local_b8[uVar10];
    }
  }
  else {
    iVar6 = diff(local_b8,uVar5,local_34,local_c0);
    local_78 = CONCAT44(extraout_var,iVar6);
  }
  lVar13 = (long)(int)uVar12;
  lVar14 = lVar13 * 8;
  iVar6 = r + 1;
  local_80 = (double *)malloc(lVar14 * iVar6);
  iVar4 = -D;
  local_70 = (double *)CONCAT44(local_70._4_4_,iVar4);
  local_41 = imean == 1 && iVar4 == local_34;
  if (imean == 1 && iVar4 == local_34) {
    uVar8 = 0;
    uVar10 = 0;
    if (0 < (int)uVar12) {
      uVar10 = (ulong)uVar12;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      local_80[uVar8] = 1.0;
    }
    if (0 < r) {
      memcpy(local_80 + lVar13,local_40,(ulong)(uint)r * lVar14);
    }
    uVar12 = (uint)local_68 + 1;
  }
  else {
    uVar12 = (uint)local_68;
    if (0 < (int)(uint)local_68) {
      memcpy(local_80,local_40,((ulong)local_68 & 0xffffffff) * lVar14);
      uVar5 = (uint)local_58;
      uVar12 = r;
      goto LAB_00113dca;
    }
  }
  uVar5 = (uint)local_58;
LAB_00113dca:
  uVar8 = (ulong)uVar12;
  local_c8 = (double *)(long)(int)local_78;
  local_40 = (double *)((long)local_c8 * 8);
  local_68 = (double *)malloc((long)iVar6 * (long)local_40);
  local_a8 = uVar8;
  local_60 = uVar8;
  if ((int)uVar12 < 1) {
    iVar6 = (int)local_b0;
    iVar4 = (int)local_98;
  }
  else {
    uVar12 = local_48;
    if (0 < D) {
      lVar14 = 0;
      pdVar9 = local_80;
      while (bVar21 = uVar8 != 0, uVar8 = uVar8 - 1, bVar21) {
        pdVar19 = (double *)((long)local_68 + lVar14);
        diffs(pdVar9,local_48,D,s,pdVar19);
        pxVar3 = local_50;
        memcpy((void *)((long)local_80 + lVar14),pdVar19,(size_t)local_50);
        pdVar9 = pdVar9 + lVar13;
        lVar14 = lVar14 + (long)pxVar3;
      }
      uVar12 = (uint)local_90;
    }
    if (0 < local_34) {
      pdVar9 = local_80;
      uVar8 = local_a8;
      pdVar19 = local_68;
      while (bVar21 = uVar8 != 0, uVar8 = uVar8 - 1, bVar21) {
        diff(pdVar9,uVar12,local_34,pdVar19);
        pdVar9 = pdVar9 + (int)uVar12;
        pdVar19 = (double *)((long)pdVar19 + (long)local_40);
      }
    }
    pdVar19 = local_68;
    pdVar9 = local_80;
    uVar8 = local_a8;
    if ((int)local_70 == local_34) {
      memcpy(local_68,local_80,(long)local_40 * local_a8);
    }
    iVar4 = (int)local_78;
    iVar6 = (int)local_60;
    iVar7 = rank(pdVar19,iVar4,iVar6);
    if (iVar7 < iVar6) {
      puts("Exogenous Variables are collinear. ");
      free(local_b8);
      free(pdVar9);
      free(pdVar19);
      free(local_c0);
      return 7;
    }
    obj = reg_init(iVar4,iVar6);
    sVar1 = uVar8 * 8;
    local_50 = (xlik_object)malloc(sVar1 * uVar8);
    pdVar9 = (double *)malloc((size_t)local_40);
    local_d8 = malloc(sVar1);
    local_d0 = malloc(sVar1);
    setIntercept(obj,0);
    pxVar3 = local_50;
    local_40 = pdVar9;
    regress(obj,pdVar19,local_c0,pdVar9,(double *)local_50,0.95);
    for (lVar14 = 0; sVar1 - lVar14 != 0; lVar14 = lVar14 + 8) {
      *(undefined8 *)((long)local_d8 + lVar14) =
           *(undefined8 *)((long)&obj->beta[0].value + lVar14 * 4);
      *(double *)((long)local_d0 + lVar14) =
           *(double *)((long)&obj->beta[0].stdErr + lVar14 * 4) * 10.0;
    }
    free(pxVar3);
    free(local_40);
    free_reg(obj);
    uVar5 = (uint)local_58;
    iVar6 = (int)local_b0;
    iVar4 = (int)local_98;
    iVar7 = s;
  }
  uVar8 = local_a8;
  M = (int)local_60;
  N_00 = (int)local_78;
  local_50 = xlik_init(uVar5,local_34,iVar4,iVar7,iVar6,D,(int)local_a0,M,N_00);
  iVar7 = local_50->offset;
  local_50->N = N_00;
  local_50->M = M;
  lVar14 = (long)local_50->pq;
  sVar1 = lVar14 * 8;
  pdVar9 = (double *)malloc(sVar1);
  local_70 = (double *)malloc(sVar1);
  local_90 = (double *)malloc(sVar1 * lVar14);
  pdVar19 = (double *)malloc(sVar1);
  local_40 = (double *)lVar14;
  _p_local = (int *)malloc(lVar14 << 2);
  uVar10 = 0;
  uVar17 = 0;
  if (0 < (int)uVar5) {
    uVar17 = (ulong)uVar5;
  }
  for (; uVar17 != uVar10; uVar10 = uVar10 + 1) {
    pdVar9[uVar10] = phi[uVar10];
  }
  uVar10 = 0;
  uVar18 = 0;
  if (0 < (int)local_98) {
    uVar18 = local_98 & 0xffffffff;
  }
  for (; uVar18 != uVar10; uVar10 = uVar10 + 1) {
    pdVar9[(long)(int)uVar5 + uVar10] = -theta[uVar10];
  }
  iVar6 = uVar5 + (int)local_98;
  uVar10 = 0;
  uVar20 = 0;
  if (0 < (int)local_b0) {
    uVar20 = local_b0 & 0xffffffff;
  }
  for (; uVar20 != uVar10; uVar10 = uVar10 + 1) {
    pdVar9[(long)iVar6 + uVar10] = PHI[uVar10];
  }
  uVar12 = iVar6 + (int)local_b0;
  local_58 = (ulong)uVar12;
  uVar10 = 0;
  uVar15 = 0;
  if (0 < (int)local_a0) {
    uVar15 = local_a0 & 0xffffffff;
  }
  for (; uVar15 != uVar10; uVar10 = uVar10 + 1) {
    pdVar9[(long)(int)uVar12 + uVar10] = -THETA[uVar10];
  }
  if (0 < (int)local_60) {
    for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      pdVar9[(long)(int)(uVar12 + (int)local_a0) + uVar10] =
           *(double *)((long)local_d8 + uVar10 * 8);
    }
  }
  local_50->mean = 0.0;
  iVar4 = (int)local_78;
  pvVar11 = (void *)0x0;
  as154_min.params = (void *)0x0;
  if (0 < iVar4) {
    as154_min.params = (void *)(local_78 & 0xffffffff);
  }
  for (; as154_min.params != pvVar11; pvVar11 = (void *)((long)pvVar11 + 1)) {
    dVar2 = local_c0[(long)pvVar11];
    local_50->x[(long)(iVar7 + iVar4 * 2) + (long)pvVar11] = dVar2;
    local_50->x[(long)iVar7 + (long)pvVar11] = dVar2;
  }
  for (; (long)local_c8 < (long)(iVar4 * 2); local_c8 = (double *)((long)local_c8 + 1)) {
    local_50->x[(long)iVar7 + (long)local_c8] = 0.0;
  }
  if (0 < (int)local_60) {
    pdVar16 = local_68;
    for (lVar14 = (long)(iVar4 * 3); lVar14 < ((int)local_60 + 3) * iVar4; lVar14 = lVar14 + 1) {
      local_50->x[iVar7 + lVar14] = *pdVar16;
      pdVar16 = pdVar16 + 1;
    }
  }
  local_130 = (undefined1  [8])fas154x_seas;
  as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)local_50;
  local_c8 = pdVar9;
  local_84 = fminunc((custom_function *)local_130,(custom_gradient *)0x0,(int)local_40,pdVar9,1.0,
                     local_84,local_70);
  if ((0xf < local_84) || ((0x8011U >> (local_84 & 0x1f) & 1) == 0)) {
    local_84 = 1;
  }
  pdVar9 = local_70 + (int)uVar5;
  iVar4 = (int)local_98;
  if (0 < iVar4) {
    invertroot(iVar4,pdVar9);
    iVar4 = (int)local_98;
  }
  if (0 < (int)local_a0) {
    invertroot((int)local_a0,pdVar9 + (long)iVar4 + (long)(int)local_b0);
  }
  uVar5 = (int)local_40 - (int)local_60;
  uVar10 = 0;
  uVar8 = 0;
  if (0 < (int)uVar5) {
    uVar8 = (ulong)uVar5;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    pdVar19[uVar10] = 1.0;
  }
  uVar8 = 0;
  uVar10 = 0;
  if (0 < (int)local_60) {
    uVar10 = local_60 & 0xffffffff;
  }
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    pdVar19[(long)(int)uVar5 + uVar8] = *(double *)((long)local_d0 + uVar8 * 8);
  }
  hessian_fd((custom_function *)local_130,local_70,(int)local_40,pdVar19,local_50->eps,hess);
  mtranspose(hess,(int)local_40,(int)local_40,local_90);
  iVar4 = (int)local_40;
  for (uVar8 = 0; (uint)(iVar4 * iVar4) != uVar8; uVar8 = uVar8 + 1) {
    local_90[uVar8] =
         (hess[uVar8] + local_90[uVar8]) * (double)(int)(local_48 - (local_e4 + local_34)) * 0.5;
  }
  ludecomp(local_90,iVar4,_p_local);
  minverse(local_90,(int)local_40,_p_local,hess);
  __ptr_00 = local_68;
  __ptr = local_70;
  pdVar16 = local_80;
  for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
    phi[uVar8] = local_70[uVar8];
  }
  for (uVar8 = 0; uVar18 != uVar8; uVar8 = uVar8 + 1) {
    theta[uVar8] = -pdVar9[uVar8];
  }
  for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
    PHI[uVar8] = local_70[(long)iVar6 + uVar8];
  }
  for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
    THETA[uVar8] = -local_70[(long)(int)uVar12 + uVar8];
  }
  iVar6 = (int)local_60;
  if (local_41 == '\0') {
    *wmean = 0.0;
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      exog[uVar8] = local_70[(long)((int)local_58 + (int)local_a0) + uVar8];
    }
  }
  else {
    lVar14 = (long)((int)local_58 + (int)local_a0);
    *wmean = local_70[lVar14];
    if (1 < iVar6) {
      for (lVar13 = 0; local_a8 - 1 != lVar13; lVar13 = lVar13 + 1) {
        exog[lVar13] = local_70[lVar14 + lVar13 + 1];
      }
    }
  }
  *var = local_50->ssq / (double)(int)local_78;
  for (pvVar11 = (void *)0x0; as154_min.params != pvVar11; pvVar11 = (void *)((long)pvVar11 + 1)) {
    resid[(long)pvVar11] = local_50->x[(long)(iVar7 + (int)local_78) + (long)pvVar11];
  }
  *loglik = local_50->loglik;
  free(local_c8);
  free(__ptr);
  free(local_c0);
  free(local_90);
  free(_p_local);
  free(pdVar19);
  free(local_b8);
  free(pdVar16);
  free(__ptr_00);
  if (0 < iVar6) {
    free(local_d8);
    free(local_d0);
  }
  free(local_50);
  return local_84;
}

Assistant:

int as154x(double *inp, int N, double *xreg, int optmethod, int p, int d, int q, int s, int P, int D, int Q, double *phi, double *theta, 
 	double *PHI, double *THETA, double *exog, int r, double *wmean, double *var,double *resid,double *loglik,double *hess,int cssml,int start,int imean) {
	int i,pq,retval,length,ret,ncxreg,nd,offset,N1,rnk,orig,ERR;
	double *b,*tf,*x,*dx,*thess,*XX,*varcovar,*res,*x0,*inp2,*U,*V,*SIG,*coeff,*sigma;
	int *ipiv;
	double maxstep;
	xlik_object obj;
	reg_object fit;

	length = N;// length of xreg as x is differenced first
	
	maxstep = 1.0;
	ncxreg = (xreg == NULL) ? 0 : r;
	nd = d + D;

	if (cssml == 1) {
		ERR = cssx(inp, N, xreg, optmethod, p, d, q, s, P, D, Q, phi, theta, PHI, THETA,exog,r, wmean, var, loglik, hess,start,imean);

		if ( ERR != 1) return ERR;

		ERR = checkroots_cerr(phi, &p, theta, &q, PHI, &P, THETA, &Q);
		if (ERR == 10 || ERR == 12) return ERR;
	}
	else {

		if (start == 0) {
			for (i = 0; i < p; ++i) phi[i] = 0.0;
			for (i = 0; i < q; ++i) theta[i] = 0.0;
			for (i = 0; i < P; ++i) PHI[i] = 0.0;
			for (i = 0; i < Q; ++i) THETA[i] = 0.0;
		}
	}

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	//mdisplay(x,1,N);

	x0 = (double*) malloc(sizeof(double)*length*(r+1));

	if (nd == 0 && imean == 1) {
		for(i = 0; i < length;++i) {
			x0[i] = 1.0;
		}
		if (r > 0) {
			memcpy(x0+length,xreg,sizeof(double)*r*length);
		}
		ncxreg++;
	} else {
		if (ncxreg > 0) {
			memcpy(x0,xreg,sizeof(double)*ncxreg*length);
		}
	}
	XX = (double*) malloc(sizeof(double)*N*(r+1));

	if (ncxreg > 0) {
		N1 = length;
		// x0 differenced and stored back in x0. Also stored in XX
		if (D > 0) {
			N1 = length - s*D;
			for(i = 0; i < ncxreg;++i) {
				diffs(x0+length*i,length,D,s,XX+N1*i);
				memcpy(x0+N1*i,XX+N1*i,sizeof(double)*N1);
			}
		} 
		// x0 differenced to XX
		if (d > 0) {
			for(i = 0; i < ncxreg;++i) {
				diff(x0+N1*i,N1,d,XX+N*i);
			}
		} 
		// Copy x0 to XX
		if (nd == 0) {
			memcpy(XX,x0,sizeof(double)*N*ncxreg);
		}

		rnk = rank(XX,N,ncxreg);

		if (rnk < ncxreg) {
			ERR = 7;
			printf("Exogenous Variables are collinear. \n");
			free(inp2);
			free(x0);
			free(XX);
			free(x);
			return ERR;
		}

	}


	orig = 0;

	if (ncxreg > 0) {
		if (ncxreg == 1) orig = 1;

		fit = reg_init(N,ncxreg);

		varcovar = (double*)malloc(sizeof(double)*ncxreg*ncxreg);
		res = (double*)malloc(sizeof(double)*N);
		coeff = (double*)malloc(sizeof(double)*ncxreg);
		sigma = (double*)malloc(sizeof(double)*ncxreg);

		setIntercept(fit,0);
		regress(fit,XX,x,res,varcovar,0.95);

		for(i = 0; i < ncxreg;++i) {
			coeff[i] = (fit->beta+i)->value;
			sigma[i] = 10.0 * (fit->beta+i)->stdErr;
			//printf("coeff %g sigma %g ",coeff[i],sigma[i]);
		}

		free(varcovar);
		free(res);
		free_reg(fit);
	}

	
 
	obj = xlik_init(p,d,q,s,P,D,Q,ncxreg,N);


	offset = obj->offset;

	obj->N = N;
	obj->M = ncxreg;
	obj->mean = *wmean;
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);


	// Initialize Parameters

	//mdisplay(theta,1,q);
	//mdisplay(THETA,1,Q);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (ncxreg > 0) {
		for(i = 0; i < ncxreg;++i) {
			b[p + q + P + Q + i] = coeff[i]; // exog
		}
	}

	


	obj->mean = 0.0;

	// Set data vector

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}

	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	if (ncxreg > 0) {
		for(i = 3 * N; i < (3 + ncxreg)*N; ++i) {
			obj->x[offset + i] = XX[i - 3*N];
		}
	}


	custom_function as154_min = { fas154x_seas, obj };
	retval = fminunc(&as154_min, NULL, pq, b,maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	if (q > 0) {
		invertroot(q,tf+p);
	}

	if (Q > 0) {
		invertroot(Q,tf+p+q+P);
	}



	for (i = 0; i < pq - ncxreg; ++i) {
		dx[i] = 1.0;
	}

	for(i = 0; i < ncxreg; ++i) {
		dx[pq - ncxreg + i] = sigma[i];
	}

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);
	
	mtranspose(hess, pq, pq, thess);
	

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}
	

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}
	

	if (nd == 0 && imean == 1) {
		*wmean = tf[p + q + Q + P];
		if (ncxreg > 1) {
			for(i = 1; i < ncxreg;++i) {
				exog[i-1] = tf[p + q + Q + P + i];
			}
		}
	} else {
		*wmean = 0.0;
		for(i = 0; i < ncxreg; ++i) {
			exog[i] = tf[p + q + Q + P + i];
		}
	}


	*var = (obj->ssq) / (double) N;

	for (i = 0; i < N; ++i) {
		resid[i] = obj->x[offset + N + i];
	}
	*loglik = obj->loglik;

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(ipiv);
	free(dx);
	free(inp2);
	free(x0);
	free(XX); 
	if (ncxreg > 0) {
		free(coeff);
		free(sigma);
	}
	
	free_xlik(obj);
	return ret;
}